

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<slang::syntax::VariableDimensionSyntax_*,_5UL>::SmallVector(void *param_1)

{
  size_type in_stack_ffffffffffffffd8;
  SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *in_stack_ffffffffffffffe0;
  
  SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::SmallVectorBase
            ((SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *)param_1,5);
  SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }